

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadDataCountSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Index local_28;
  Enum local_24;
  Index data_count;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _data_count = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa1])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    RVar2 = ReadIndex(this,&local_28,"data count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa2])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa3])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          this->data_count_ = local_28;
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndDataCountSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnDataCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginDataCountSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDataCountSection(Offset section_size) {
  CALLBACK(BeginDataCountSection, section_size);
  Index data_count;
  CHECK_RESULT(ReadIndex(&data_count, "data count"));
  CALLBACK(OnDataCount, data_count);
  CALLBACK0(EndDataCountSection);
  data_count_ = data_count;
  return Result::Ok;
}